

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

size_t replace_url_encoded_space_by_plus(char *url)

{
  size_t sVar1;
  size_t local_28;
  size_t new_index;
  size_t orig_index;
  size_t orig_len;
  char *url_local;
  
  sVar1 = strlen(url);
  new_index = 0;
  local_28 = 0;
  while (new_index < sVar1) {
    if (((url[new_index] == '%') && (url[new_index + 1] == '2')) && (url[new_index + 2] == '0')) {
      url[local_28] = '+';
      new_index = new_index + 3;
    }
    else {
      if (local_28 != new_index) {
        url[local_28] = url[new_index];
      }
      new_index = new_index + 1;
    }
    local_28 = local_28 + 1;
  }
  url[local_28] = '\0';
  return local_28;
}

Assistant:

static size_t replace_url_encoded_space_by_plus(char *url)
{
  size_t orig_len = strlen(url);
  size_t orig_index = 0;
  size_t new_index = 0;

  while(orig_index < orig_len) {
    if((url[orig_index] == '%') &&
       (url[orig_index + 1] == '2') &&
       (url[orig_index + 2] == '0')) {
      url[new_index] = '+';
      orig_index += 3;
    }
    else{
      if(new_index != orig_index) {
        url[new_index] = url[orig_index];
      }
      orig_index++;
    }
    new_index++;
  }

  url[new_index] = 0; /* terminate string */

  return new_index; /* new size */
}